

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.h
# Opt level: O1

EffectiveSign __thiscall
slang::ast::ConversionExpression::getEffectiveSignImpl
          (ConversionExpression *this,bool isForConversion)

{
  bool bVar1;
  EffectiveSign EVar2;
  
  if ((int)this->conversionKind < 2) {
    EVar2 = Expression::getEffectiveSign(this->operand_,isForConversion);
    return EVar2;
  }
  bVar1 = Type::isSigned((this->super_Expression).type.ptr);
  return (EffectiveSign)bVar1;
}

Assistant:

bool isImplicit() const { return conversionKind < ConversionKind::StreamingConcat; }